

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O2

TestStatus *
vkt::pipeline::anon_unknown_0::testNoAtt
          (TestStatus *__return_storage_ptr__,Context *context,bool multisample)

{
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  TestLog *log;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  IVec3 renderSize_00;
  TestStatus *__return_storage_ptr___00;
  Handle<(vk::HandleType)17> renderPass;
  Handle<(vk::HandleType)16> pipelineLayout;
  Handle<(vk::HandleType)14> fragmentModule;
  Handle<(vk::HandleType)14> vertexModule;
  bool bVar2;
  deUint32 dVar3;
  int iVar4;
  VkResult result;
  VkPhysicalDeviceFeatures *pVVar5;
  DeviceInterface *deviceInterface;
  VkDevice pVVar6;
  VkQueue queue;
  Allocator *allocator;
  ProgramBinary *pPVar7;
  TextureFormat format_00;
  DescriptorSetLayoutBuilder *this;
  DescriptorPoolBuilder *this_00;
  DescriptorSetUpdateBuilder *this_01;
  NotSupportedError *this_02;
  int z;
  size_t size;
  int y;
  int y_00;
  int x;
  int x_00;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffbac;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  VkImageUsageFlags in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbc0;
  VkDevice pVVar12;
  VkDevice device;
  allocator<char> local_419;
  VkSubpassDescription subpassDescription;
  VkDeviceSize vertexBufferOffset;
  undefined8 uStack_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  void *local_3a8;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  deUint32 dStack_398;
  undefined4 uStack_394;
  VkSubpassDependency *pVStack_390;
  RefBase<vk::VkCommandBuffer_s_*> local_388;
  TestStatus *local_368;
  ulong local_360;
  IVec3 renderSize;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferAlloc;
  Move<vk::Handle<(vk::HandleType)23>_> framebuffer;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipeline;
  TextureFormat format;
  Move<vk::Handle<(vk::HandleType)9>_> image;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_248;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_228;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined4 local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined4 local_1d8;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_1c8;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> imageAlloc;
  VkDescriptorImageInfo descriptorImageInfo;
  Vector<int,_3> local_174;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_168;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_148;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_128;
  string local_100;
  Move<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_a0;
  Move<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)13>_> imageView;
  IVec3 imageDim;
  
  pVVar5 = Context::getDeviceFeatures(context);
  if (pVVar5->fragmentStoresAndAtomics != 0) {
    deviceInterface = Context::getDeviceInterface(context);
    pVVar6 = Context::getDevice(context);
    queue = Context::getUniversalQueue(context);
    dVar3 = Context::getUniversalQueueFamilyIndex(context);
    local_368 = (TestStatus *)CONCAT44(local_368._4_4_,dVar3);
    allocator = Context::getDefaultAllocator(context);
    renderSize.m_data[0] = 0x20;
    renderSize.m_data[1] = 0x20;
    renderSize.m_data[2] = 1;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    vertexBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
    ptr = (Allocation *)0x0;
    pPVar1 = context->m_progCollection;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vertexBufferOffset,"vert",(allocator<char> *)&vertices);
    pPVar7 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&vertexBufferOffset);
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&subpassDescription,deviceInterface,pVVar6,
               pPVar7,0);
    local_128.m_data.deleter.m_device = (VkDevice)subpassDescription.pInputAttachments;
    local_128.m_data.deleter.m_allocator = (VkAllocationCallbacks *)subpassDescription._24_8_;
    local_128.m_data.object.m_internal._0_4_ = subpassDescription.flags;
    local_128.m_data.object.m_internal._4_4_ = subpassDescription.pipelineBindPoint;
    local_128.m_data.deleter.m_deviceIface = (DeviceInterface *)subpassDescription._8_8_;
    subpassDescription.flags = 0;
    subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    subpassDescription.inputAttachmentCount = 0;
    subpassDescription._12_4_ = 0;
    subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
    subpassDescription.colorAttachmentCount = 0;
    subpassDescription._28_4_ = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&subpassDescription);
    std::__cxx11::string::~string((string *)&vertexBufferOffset);
    pPVar1 = context->m_progCollection;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vertexBufferOffset,"frag",(allocator<char> *)&vertices);
    pPVar7 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&vertexBufferOffset);
    pVVar12 = pVVar6;
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&subpassDescription,deviceInterface,pVVar6,
               pPVar7,0);
    local_148.m_data.deleter.m_device = (VkDevice)subpassDescription.pInputAttachments;
    local_148.m_data.deleter.m_allocator = (VkAllocationCallbacks *)subpassDescription._24_8_;
    local_148.m_data.object.m_internal._0_4_ = subpassDescription.flags;
    local_148.m_data.object.m_internal._4_4_ = subpassDescription.pipelineBindPoint;
    local_148.m_data.deleter.m_deviceIface = (DeviceInterface *)subpassDescription._8_8_;
    subpassDescription.flags = 0;
    subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    subpassDescription.inputAttachmentCount = 0;
    subpassDescription._12_4_ = 0;
    subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
    subpassDescription.colorAttachmentCount = 0;
    subpassDescription._28_4_ = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&subpassDescription);
    std::__cxx11::string::~string((string *)&vertexBufferOffset);
    imageDim.m_data[1] = (uint)multisample + (uint)multisample * 2 + 1;
    local_360 = (ulong)(uint)imageDim.m_data[1];
    imageDim.m_data[0] = 4;
    imageDim.m_data[2] = 1;
    makeImage(&image,deviceInterface,pVVar6,1,(VkImageType)&imageDim,VK_FORMAT_R4G4_UNORM_PACK8,
              (IVec3 *)CONCAT44(in_stack_fffffffffffffbac,9),0,in_stack_fffffffffffffbb8,
              (bool)in_stack_fffffffffffffbc0);
    bindImage(&imageAlloc,deviceInterface,pVVar6,allocator,
              (VkImage)image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,
              (MemoryRequirement)0x0);
    local_1e8 = 1;
    uStack_1e0 = 1;
    local_1d8 = 1;
    uVar8 = 1;
    uVar9 = 0;
    uVar10 = 1;
    uVar11 = 0;
    subresourceRange.levelCount = 1;
    subresourceRange.aspectMask = 1;
    subresourceRange.baseMipLevel = 0;
    subresourceRange.baseArrayLayer = 0;
    subresourceRange.layerCount = 1;
    makeImageView(&imageView,deviceInterface,pVVar6,
                  (VkImage)image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                           m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                  subresourceRange);
    format_00 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    iVar4 = tcu::getPixelSize(format_00);
    pVVar6 = pVVar12;
    makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&subpassDescription,deviceInterface,pVVar12,
               (long)(iVar4 << ((multisample & 7U) << 2 | 2)),2);
    local_228.m_data.deleter.m_device = (VkDevice)subpassDescription.pInputAttachments;
    local_228.m_data.deleter.m_allocator = (VkAllocationCallbacks *)subpassDescription._24_8_;
    local_228.m_data.object.m_internal._0_4_ = subpassDescription.flags;
    local_228.m_data.object.m_internal._4_4_ = subpassDescription.pipelineBindPoint;
    local_228.m_data.deleter.m_deviceIface = (DeviceInterface *)subpassDescription._8_8_;
    subpassDescription.flags = 0;
    subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    subpassDescription.inputAttachmentCount = 0;
    subpassDescription._12_4_ = 0;
    subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
    subpassDescription.colorAttachmentCount = 0;
    subpassDescription._28_4_ = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&subpassDescription);
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&subpassDescription,
               deviceInterface,pVVar12,allocator,(VkBuffer)local_228.m_data.object.m_internal,
               (MemoryRequirement)0x1);
    colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
    ptr = (Allocation *)subpassDescription._0_8_;
    subpassDescription.flags = 0;
    subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &subpassDescription);
    ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)&subpassDescription);
    this = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     ((DescriptorSetLayoutBuilder *)&subpassDescription,
                      VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x10);
    ::vk::DescriptorSetLayoutBuilder::build(&descriptorSetLayout,this,deviceInterface,pVVar12,0);
    ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)&subpassDescription);
    ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&subpassDescription)
    ;
    this_00 = ::vk::DescriptorPoolBuilder::addType
                        ((DescriptorPoolBuilder *)&subpassDescription,
                         VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
    ::vk::DescriptorPoolBuilder::build(&descriptorPool,this_00,deviceInterface,pVVar12,1,1);
    std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
    ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                   *)&subpassDescription);
    makeDescriptorSet(&descriptorSet,deviceInterface,pVVar12,
                      (VkDescriptorPool)
                      descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
                      m_internal,
                      (VkDescriptorSetLayout)
                      descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                      object.m_internal);
    descriptorImageInfo.sampler.m_internal = 0;
    descriptorImageInfo.imageView.m_internal =
         imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    descriptorImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)&subpassDescription);
    vertexBufferOffset = 0;
    this_01 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                        ((DescriptorSetUpdateBuilder *)&subpassDescription,
                         (VkDescriptorSet)
                         descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                         m_internal,(Location *)&vertexBufferOffset,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE
                         ,&descriptorImageInfo);
    ::vk::DescriptorSetUpdateBuilder::update(this_01,deviceInterface,pVVar12);
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)&subpassDescription);
    makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&subpassDescription,deviceInterface,
                       pVVar12,(VkDescriptorSetLayout)
                               descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                               m_data.object.m_internal);
    local_1c8.m_data.deleter.m_device = (VkDevice)subpassDescription.pInputAttachments;
    local_1c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)subpassDescription._24_8_;
    local_1c8.m_data.object.m_internal._0_4_ = subpassDescription.flags;
    local_1c8.m_data.object.m_internal._4_4_ = subpassDescription.pipelineBindPoint;
    local_1c8.m_data.deleter.m_deviceIface = (DeviceInterface *)subpassDescription._8_8_;
    subpassDescription.flags = 0;
    subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    subpassDescription.inputAttachmentCount = 0;
    subpassDescription._12_4_ = 0;
    subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
    subpassDescription.colorAttachmentCount = 0;
    subpassDescription._28_4_ = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&subpassDescription);
    pipeline.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pipeline.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pipeline.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    subpassDescription.pDepthStencilAttachment = (VkAttachmentReference *)0x0;
    subpassDescription.preserveAttachmentCount = 0;
    subpassDescription._60_4_ = 0;
    subpassDescription.pColorAttachments = (VkAttachmentReference *)0x0;
    subpassDescription.pResolveAttachments = (VkAttachmentReference *)0x0;
    subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
    subpassDescription.colorAttachmentCount = 0;
    subpassDescription._28_4_ = 0;
    subpassDescription.flags = 0;
    subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    subpassDescription.inputAttachmentCount = 0;
    subpassDescription._12_4_ = 0;
    subpassDescription.pPreserveAttachments = (deUint32 *)0x0;
    std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::push_back
              ((vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)
               &framebuffer,&subpassDescription);
    uStack_3c0 = (DeviceInterface *)0x0;
    dStack_398 = 0;
    uStack_394 = 0;
    pVStack_390 = (VkSubpassDependency *)0x0;
    local_3b8._M_allocated_capacity = 0;
    local_3b8._8_8_ = 0;
    vertexBufferOffset = 0x26;
    local_3a8 = (void *)0x1;
    uStack_3a0 = (undefined4)
                 framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
    ;
    uStack_39c = (undefined4)
                 (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
                  m_internal >> 0x20);
    device = pVVar6;
    ::vk::createRenderPass
              ((Move<vk::Handle<(vk::HandleType)17>_> *)&vertices,deviceInterface,pVVar6,
               (VkRenderPassCreateInfo *)&vertexBufferOffset,(VkAllocationCallbacks *)0x0);
    std::_Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::
    ~_Vector_base((_Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                   *)&framebuffer);
    local_248.m_data.object.m_internal =
         (deUint64)
         vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_248.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_248.m_data.deleter.m_device =
         (VkDevice)
         vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&vertices);
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&subpassDescription,deviceInterface,pVVar6,2
               ,(deUint32)local_368,(VkAllocationCallbacks *)0x0);
    local_168.m_data.deleter.m_device = (VkDevice)subpassDescription.pInputAttachments;
    local_168.m_data.deleter.m_allocator = (VkAllocationCallbacks *)subpassDescription._24_8_;
    local_168.m_data.object.m_internal._0_4_ = subpassDescription.flags;
    local_168.m_data.object.m_internal._4_4_ = subpassDescription.pipelineBindPoint;
    local_168.m_data.deleter.m_deviceIface = (DeviceInterface *)subpassDescription._8_8_;
    subpassDescription.flags = 0;
    subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    subpassDescription.inputAttachmentCount = 0;
    subpassDescription._12_4_ = 0;
    subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
    subpassDescription.colorAttachmentCount = 0;
    subpassDescription._28_4_ = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&subpassDescription);
    makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&subpassDescription,deviceInterface,pVVar6,
                      (VkCommandPool)local_168.m_data.object.m_internal);
    local_388.m_data.deleter.m_device = (VkDevice)subpassDescription.pInputAttachments;
    local_388.m_data.deleter.m_pool.m_internal = subpassDescription._24_8_;
    local_388.m_data.object = (VkCommandBuffer_s *)subpassDescription._0_8_;
    local_388.m_data.deleter.m_deviceIface = (DeviceInterface *)subpassDescription._8_8_;
    subpassDescription.flags = 0;
    subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    subpassDescription.inputAttachmentCount = 0;
    subpassDescription._12_4_ = 0;
    subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
    subpassDescription.colorAttachmentCount = 0;
    subpassDescription._28_4_ = 0;
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
              ((RefBase<vk::VkCommandBuffer_s_*> *)&subpassDescription);
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    subpassDescription.flags = 0xbe800000;
    subpassDescription.pipelineBindPoint = 0xbe800000;
    subpassDescription.inputAttachmentCount = 0;
    subpassDescription._12_4_ = 0x3f800000;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
               (Vector<float,_4> *)&subpassDescription);
    subpassDescription.flags = 0xbe800000;
    subpassDescription.pipelineBindPoint = 0x3e800000;
    subpassDescription.inputAttachmentCount = 0;
    subpassDescription._12_4_ = 0x3f800000;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
               (Vector<float,_4> *)&subpassDescription);
    subpassDescription.flags = 0x3e800000;
    subpassDescription.pipelineBindPoint = 0xbe800000;
    subpassDescription.inputAttachmentCount = 0;
    subpassDescription._12_4_ = 0x3f800000;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
               (Vector<float,_4> *)&subpassDescription);
    subpassDescription.flags = 0x3e800000;
    subpassDescription.pipelineBindPoint = 0x3e800000;
    subpassDescription.inputAttachmentCount = 0;
    subpassDescription._12_4_ = 0x3f800000;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
               (Vector<float,_4> *)&subpassDescription);
    size = (long)vertices.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)vertices.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset,deviceInterface,device,
               size,0x80);
    subpassDescription.pInputAttachments = (VkAttachmentReference *)local_3b8._M_allocated_capacity;
    subpassDescription._24_8_ = local_3b8._8_8_;
    subpassDescription.flags = (undefined4)vertexBufferOffset;
    subpassDescription.pipelineBindPoint = vertexBufferOffset._4_4_;
    subpassDescription._8_8_ = uStack_3c0;
    vertexBufferOffset = 0;
    uStack_3c0 = (DeviceInterface *)0x0;
    local_3b8._M_allocated_capacity = 0;
    local_3b8._8_8_ = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
              (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)subpassDescription.pInputAttachments;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)subpassDescription._24_8_;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_ =
         subpassDescription.flags;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._4_4_ =
         subpassDescription.pipelineBindPoint;
    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)subpassDescription._8_8_;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset);
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&subpassDescription,
               deviceInterface,device,allocator,
               (VkBuffer)
               vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
               (MemoryRequirement)0x1);
    subpassDescription.flags = 0;
    subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    data.ptr._4_4_ = uVar9;
    data.ptr._0_4_ = uVar8;
    data._8_4_ = uVar10;
    data._12_4_ = uVar11;
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
              (&vertexBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data);
    local_368 = __return_storage_ptr__;
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &subpassDescription);
    memcpy((vertexBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
            m_data.ptr)->m_hostPtr,
           vertices.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start,size);
    pVVar12 = device;
    ::vk::flushMappedMemoryRange
              (deviceInterface,device,
               (VkDeviceMemory)
               ((vertexBufferAlloc.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (vertexBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,size);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&vertices.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    vertexModule.m_internal = local_128.m_data.object.m_internal;
    fragmentModule.m_internal = local_148.m_data.object.m_internal;
    pipelineLayout.m_internal = local_1c8.m_data.object.m_internal;
    renderPass.m_internal = local_248.m_data.object.m_internal;
    tcu::Vector<int,_3>::Vector(&local_174,&renderSize);
    renderSize_00.m_data[2] = 0;
    renderSize_00.m_data._0_8_ = &local_174;
    makeGraphicsPipeline
              ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_a0,deviceInterface,device,
               (VkPipelineLayout)pipelineLayout.m_internal,(VkRenderPass)renderPass.m_internal,
               (VkShaderModule)vertexModule.m_internal,(VkShaderModule)fragmentModule.m_internal,
               renderSize_00,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,multisample,SUB81(pVVar12,0));
    pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)18>>
              ((_anonymous_namespace_ *)&subpassDescription,
               (Move<vk::Handle<(vk::HandleType)18>_> *)&local_a0);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
                *)&pipeline,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
               &subpassDescription);
    pVVar6 = pVVar12;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
               &subpassDescription);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_a0);
    makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset,deviceInterface,
                    pVVar12,(VkRenderPass)local_248.m_data.object.m_internal,0,(VkImageView *)0x0,
                    renderSize.m_data[0],renderSize.m_data[1],1);
    subpassDescription.pInputAttachments = (VkAttachmentReference *)local_3b8._M_allocated_capacity;
    subpassDescription._24_8_ = local_3b8._8_8_;
    subpassDescription.flags = (undefined4)vertexBufferOffset;
    subpassDescription.pipelineBindPoint = vertexBufferOffset._4_4_;
    subpassDescription._8_8_ = uStack_3c0;
    vertexBufferOffset = 0;
    uStack_3c0 = (DeviceInterface *)0x0;
    local_3b8._M_allocated_capacity = 0;
    local_3b8._8_8_ = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
              (&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>);
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         (VkDevice)subpassDescription.pInputAttachments;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)subpassDescription._24_8_;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal._0_4_ =
         subpassDescription.flags;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal._4_4_ =
         subpassDescription.pipelineBindPoint;
    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)subpassDescription._8_8_;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset);
    beginCommandBuffer(deviceInterface,local_388.m_data.object);
    local_208 = 1;
    uStack_200 = 1;
    local_1f8 = 1;
    subresourceRange_00.levelCount = 1;
    subresourceRange_00.aspectMask = 1;
    subresourceRange_00.baseMipLevel = 0;
    subresourceRange_00.baseArrayLayer = 0;
    subresourceRange_00.layerCount = 1;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)&subpassDescription,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
               VK_IMAGE_LAYOUT_GENERAL,
               (VkImage)image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
               ,subresourceRange_00);
    (*deviceInterface->_vptr_DeviceInterface[0x6d])
              (deviceInterface,local_388.m_data.object,1,0x80,0,0,0,0,0,1,&subpassDescription);
    subpassDescription.flags = 0x2b;
    subpassDescription.inputAttachmentCount = 0;
    subpassDescription._12_4_ = 0;
    subpassDescription.pInputAttachments =
         (VkAttachmentReference *)local_248.m_data.object.m_internal;
    subpassDescription._24_8_ =
         framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
    subpassDescription.pColorAttachments = (VkAttachmentReference *)0x0;
    subpassDescription.pResolveAttachments = (VkAttachmentReference *)renderSize.m_data._0_8_;
    subpassDescription.pDepthStencilAttachment =
         (VkAttachmentReference *)
         ((ulong)subpassDescription.pDepthStencilAttachment & 0xffffffff00000000);
    subpassDescription.preserveAttachmentCount = 0;
    subpassDescription._60_4_ = 0;
    vertexBufferOffset = 0;
    (*deviceInterface->_vptr_DeviceInterface[0x74])
              (deviceInterface,local_388.m_data.object,&subpassDescription,0);
    (*deviceInterface->_vptr_DeviceInterface[0x4c])
              (deviceInterface,local_388.m_data.object,0,
               ((pipeline.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr->
               super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal);
    (*deviceInterface->_vptr_DeviceInterface[0x58])
              (deviceInterface,local_388.m_data.object,0,1,&vertexBuffer,&vertexBufferOffset);
    (*deviceInterface->_vptr_DeviceInterface[0x56])
              (deviceInterface,local_388.m_data.object,0,local_1c8.m_data.object.m_internal,0,1,
               (int)&descriptorSet,0,0);
    (*deviceInterface->_vptr_DeviceInterface[0x59])(deviceInterface,local_388.m_data.object,4,1,0,0)
    ;
    (*deviceInterface->_vptr_DeviceInterface[0x76])(deviceInterface,local_388.m_data.object);
    subpassDescription.flags = 0x2d;
    subpassDescription.inputAttachmentCount = 0;
    subpassDescription._12_4_ = 0;
    subpassDescription.pInputAttachments = (VkAttachmentReference *)0x80000000040;
    subpassDescription.colorAttachmentCount = 1;
    subpassDescription._28_4_ = 6;
    subpassDescription.pColorAttachments = (VkAttachmentReference *)0xffffffffffffffff;
    subpassDescription.pResolveAttachments =
         (VkAttachmentReference *)
         image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    subpassDescription.pDepthStencilAttachment = (VkAttachmentReference *)0x1;
    subpassDescription.preserveAttachmentCount = 1;
    subpassDescription._60_4_ = 0;
    subpassDescription.pPreserveAttachments =
         (deUint32 *)CONCAT44(subpassDescription.pPreserveAttachments._4_4_,1);
    (*deviceInterface->_vptr_DeviceInterface[0x6d])
              (deviceInterface,local_388.m_data.object,0x400,0x1000,0,0,0,0,0,1,&subpassDescription)
    ;
    vertexBufferOffset = 0;
    uStack_3c0 = (DeviceInterface *)0x0;
    local_3b8._M_allocated_capacity = 1;
    local_3b8._8_8_ = 0x100000000;
    local_3a8 = (void *)0x0;
    uStack_3a0 = 0;
    uStack_39c = 4;
    dStack_398 = (deUint32)local_360;
    uStack_394 = 1;
    (*deviceInterface->_vptr_DeviceInterface[99])
              (deviceInterface,local_388.m_data.object,
               image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,6,
               local_228.m_data.object.m_internal,1,(int)&vertexBufferOffset);
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vertices.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2c);
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000001000;
    (*deviceInterface->_vptr_DeviceInterface[0x6d])
              (deviceInterface,local_388.m_data.object,0x1000,0x4000,0,0,0,1,(int)&vertices,0,0);
    result = (*deviceInterface->_vptr_DeviceInterface[0x4a])
                       (deviceInterface,local_388.m_data.object);
    ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineFramebufferAttachmentTests.cpp"
                      ,0x43e);
    submitCommandsAndWait(deviceInterface,pVVar6,queue,local_388.m_data.object);
    ::vk::invalidateMappedMemoryRange
              (deviceInterface,pVVar6,
               (VkDeviceMemory)
               ((colorBufferAlloc.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (colorBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,0xffffffffffffffff);
    format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::TextureLevel::TextureLevel((TextureLevel *)&subpassDescription,&format,4,(int)local_360,1);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&vertexBufferOffset,(TextureLevel *)&subpassDescription);
    for (iVar4 = 0; iVar4 < (int)local_3b8._M_allocated_capacity._0_4_; iVar4 = iVar4 + 1) {
      for (y_00 = 0; y_00 < uStack_3c0._4_4_; y_00 = y_00 + 1) {
        for (x_00 = 0; x_00 < (int)uStack_3c0; x_00 = x_00 + 1) {
          vertices.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x3f0000003f800000;
          vertices.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x3f8000003e800000;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&vertexBufferOffset,(Vec4 *)&vertices,x_00,y_00,iVar4);
        }
      }
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&vertices,&format,4,(int)local_360,1,
               (colorBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr);
    log = context->m_testCtx->m_log;
    tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&local_100,1);
    bVar2 = tcu::intThresholdCompare
                      (log,"Image Comparison","",(ConstPixelBufferAccess *)&vertexBufferOffset,
                       (ConstPixelBufferAccess *)&vertices,(UVec4 *)&local_100,COMPARE_LOG_RESULT);
    __return_storage_ptr___00 = local_368;
    if (bVar2) {
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&subpassDescription);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&subpassDescription,"Pass",(allocator<char> *)&vertexBufferOffset);
      tcu::TestStatus::pass(__return_storage_ptr___00,(string *)&subpassDescription);
      std::__cxx11::string::~string((string *)&subpassDescription);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"Fail",&local_419);
      tcu::TestStatus::fail(__return_storage_ptr___00,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&subpassDescription);
    }
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_388);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_168);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
              (&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_248);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector(&pipeline);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_1c8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
              (&descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
              (&descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
              (&descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              (&colorBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_228);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
              (&imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              (&imageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
              (&image.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_148);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_128);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              (&vertexBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    return __return_storage_ptr___00;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&subpassDescription,"fragmentStoresAndAtomics feature not supported",
             (allocator<char> *)&vertexBufferOffset);
  tcu::NotSupportedError::NotSupportedError(this_02,(string *)&subpassDescription);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus testNoAtt (Context& context, const bool multisample)
{
	const VkPhysicalDeviceFeatures		features				= context.getDeviceFeatures();
	if (!features.fragmentStoresAndAtomics)
		throw tcu::NotSupportedError("fragmentStoresAndAtomics feature not supported");

	const DeviceInterface&				vk						= context.getDeviceInterface();
	const VkDevice						device					= context.getDevice();
	const VkQueue						queue					= context.getUniversalQueue();
	const deUint32						queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	Allocator&							allocator				= context.getDefaultAllocator();
	const IVec3							renderSize				(32, 32, 1);

	Move<VkBuffer>						vertexBuffer;
	MovePtr<Allocation>					vertexBufferAlloc;

	const Unique<VkShaderModule>		vertexModule			(createShaderModule (vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>		fragmentModule			(createShaderModule (vk, device, context.getBinaryCollection().get("frag"), 0u));

	// Create image where we will record the writes. For single-sampled cases this is a 4x1 image
	// and for multi-sampled cases this is a 4x<num_samples> image.
	const deUint8						numSamples				= multisample ? 4 : 1;
	const deUint8						imageWidth				= 4;
	const deUint8						imageHeight				= numSamples;
	const deUint8						imageDepth				= 1;
	const deUint8						imageLayers				= 1;
	const IVec3							imageDim				= IVec3(imageWidth, imageHeight, imageDepth);
	const VkImageUsageFlags				imageUsage				= VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT;
	const Move<VkImage>					image					= makeImage(vk, device, VkImageViewCreateFlags(0), VK_IMAGE_TYPE_2D, COLOR_FORMAT, imageDim, imageLayers, imageUsage, false);
	const VkImageSubresourceRange		imageSubresourceRange	= makeColorSubresourceRange(0u, imageLayers);
	const MovePtr<Allocation>			imageAlloc				= bindImage(vk, device, allocator, *image, MemoryRequirement::Any);
	const Move<VkImageView>				imageView				= makeImageView(vk, device, *image, VK_IMAGE_VIEW_TYPE_2D, COLOR_FORMAT, imageSubresourceRange);

	// Create a buffer where we will copy the image for verification
	const VkDeviceSize					colorBufferSize		= imageWidth * imageHeight * imageDepth * numSamples * tcu::getPixelSize(mapVkFormat(COLOR_FORMAT));
	const Unique<VkBuffer>				colorBuffer			(makeBuffer(vk, device, colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>			colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	// Create pipeline descriptor set for the image
	const Move<VkDescriptorSetLayout>	descriptorSetLayout		= DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_FRAGMENT_BIT)
		.build(vk, device);

	const Move<VkDescriptorPool>		descriptorPool			= DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, 1)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1);

	const Move<VkDescriptorSet>			descriptorSet			= makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout);
	const VkDescriptorImageInfo			descriptorImageInfo		= makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);
	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorImageInfo)
		.update(vk, device);

	const Unique<VkPipelineLayout>		pipelineLayout			(makePipelineLayout (vk, device, *descriptorSetLayout));
	vector<SharedPtrVkPipeline>			pipeline;
	const Unique<VkRenderPass>			renderPass				(makeRenderPassNoAtt (vk, device));
	Move<VkFramebuffer>					framebuffer;

	const Unique<VkCommandPool>			cmdPool					(createCommandPool (vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>		cmdBuffer				(makeCommandBuffer (vk, device, *cmdPool));

	// create vertexBuffer
	{
		const vector<tcu::Vec4>	vertices			= genPointVertices();
		const VkDeviceSize		vertexBufferSize	= sizeInBytes(vertices);

		vertexBuffer		= makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		vertexBufferAlloc	= bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible);
		deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
		flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
	}

	// Create render pass and pipeline
	pipeline.push_back(makeSharedPtr(makeGraphicsPipeline(vk, device, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
		renderSize, VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0, false, multisample)));
	framebuffer = makeFramebuffer(vk, device, *renderPass, 0, DE_NULL, renderSize.x(), renderSize.y());

	// Record command buffer
	beginCommandBuffer(vk, *cmdBuffer);
	{
		// shader image layout transition undefined -> general
		{
			const VkImageMemoryBarrier setImageLayoutBarrier = makeImageMemoryBarrier(
				0u, VK_ACCESS_SHADER_WRITE_BIT,
				VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL,
				*image, imageSubresourceRange);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0,
				0, DE_NULL, 0, DE_NULL, 1, &setImageLayoutBarrier);
		}

		// Render pass
		{
			const VkRect2D renderArea =
			{
				makeOffset2D(0, 0),
				makeExtent2D(renderSize.x(), renderSize.y()),
			};
			const VkRenderPassBeginInfo renderPassBeginInfo =
			{
				VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// VkStructureType         sType;
				DE_NULL,									// const void*             pNext;
				*renderPass,								// VkRenderPass            renderPass;
				*framebuffer,								// VkFramebuffer           framebuffer;
				renderArea,									// VkRect2D                renderArea;
				0,											// uint32_t                clearValueCount;
				DE_NULL,									// const VkClearValue*     pClearValues;
			};
			const VkDeviceSize vertexBufferOffset = 0ull;

			vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

			vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipeline[0]);
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, pipelineLayout.get(), 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
			vk.cmdDraw(*cmdBuffer, 4u, 1u, 0u, 0u);

			vk.cmdEndRenderPass(*cmdBuffer);
		}

		// copy image to host visible colorBuffer
		{
			const VkImageMemoryBarrier	imageBarriers[]		=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
					DE_NULL,									// const void*				pNext;
					VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_GENERAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// deUint32					destQueueFamilyIndex;
					*image,										// VkImage					image;
					makeColorSubresourceRange(0, 1)				// VkImageSubresourceRange	subresourceRange;
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageBarriers);

			const VkBufferImageCopy		region				=
			{
				0ull,																// VkDeviceSize                bufferOffset;
				0u,																	// uint32_t                    bufferRowLength;
				0u,																	// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1),	// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),												// VkOffset3D                  imageOffset;
				makeExtent3D(IVec3(imageWidth, imageHeight, imageDepth)),			// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*cmdBuffer, *image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &region);

			const VkBufferMemoryBarrier	bufferBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType    sType;
					DE_NULL,									// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           dstQueueFamilyIndex;
					*colorBuffer,								// VkBuffer           buffer;
					0ull,										// VkDeviceSize       offset;
					VK_WHOLE_SIZE,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(bufferBarriers), bufferBarriers, 0u, DE_NULL);
		}
	} // beginCommandBuffer

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);
		const tcu::TextureFormat			format			= mapVkFormat(COLOR_FORMAT);
		tcu::TextureLevel					textureLevel	(format, imageWidth, imageHeight, imageDepth);
		const tcu::PixelBufferAccess		expectedImage	= getExpectedDataNoAtt(textureLevel);
		const tcu::ConstPixelBufferAccess	resultImage		(format, imageWidth, imageHeight, imageDepth, colorBufferAlloc->getHostPtr());

		if (!tcu::intThresholdCompare(context.getTestContext().getLog(), "Image Comparison", "", expectedImage, resultImage, tcu::UVec4(1), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Fail");
	}

	return tcu::TestStatus::pass("Pass");
}